

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigWin.c
# Opt level: O0

int Aig_NodeGetLeafCostOne(Aig_Obj_t *pNode,int nFanoutLimit)

{
  ulong uVar1;
  int iVar2;
  Aig_Obj_t *pAVar3;
  int Cost;
  int nFanoutLimit_local;
  Aig_Obj_t *pNode_local;
  
  if ((*(ulong *)&pNode->field_0x18 >> 4 & 1) == 0) {
    __assert_fail("pNode->fMarkA",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigWin.c"
                  ,0x32,"int Aig_NodeGetLeafCostOne(Aig_Obj_t *, int)");
  }
  iVar2 = Aig_ObjIsCi(pNode);
  if (iVar2 == 0) {
    pAVar3 = Aig_ObjFanin0(pNode);
    uVar1 = *(ulong *)&pAVar3->field_0x18;
    pAVar3 = Aig_ObjFanin1(pNode);
    pNode_local._4_4_ =
         (uint)(((uVar1 >> 4 & 1) != 0 ^ 0xffU) & 1) +
         (uint)(((*(ulong *)&pAVar3->field_0x18 >> 4 & 1) != 0 ^ 0xffU) & 1);
    if ((1 < pNode_local._4_4_) &&
       (nFanoutLimit < (int)((uint)(*(ulong *)&pNode->field_0x18 >> 6) & 0x3ffffff))) {
      pNode_local._4_4_ = 999;
    }
  }
  else {
    pNode_local._4_4_ = 999;
  }
  return pNode_local._4_4_;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Evaluate the cost of removing the node from the set of leaves.]

  Description [Returns the number of new leaves that will be brought in.
  Returns large number if the node cannot be removed from the set of leaves.]
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
static inline int Aig_NodeGetLeafCostOne( Aig_Obj_t * pNode, int nFanoutLimit )
{
    int Cost;
    // make sure the node is in the construction zone
    assert( pNode->fMarkA );  
    // cannot expand over the PI node
    if ( Aig_ObjIsCi(pNode) )
        return 999;
    // get the cost of the cone
    Cost = (!Aig_ObjFanin0(pNode)->fMarkA) + (!Aig_ObjFanin1(pNode)->fMarkA);
    // always accept if the number of leaves does not increase
    if ( Cost < 2 )
        return Cost;
    // skip nodes with many fanouts
    if ( (int)pNode->nRefs > nFanoutLimit )
        return 999;
    // return the number of nodes that will be on the leaves if this node is removed
    return Cost;
}